

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

void build_race_spec(void)

{
  nh_listitem *choices;
  int i;
  
  choices._4_4_ = 0;
  while (races[choices._4_4_].noun != (char *)0x0) {
    choices._4_4_ = choices._4_4_ + 1;
  }
  race_spec.numchoices = choices._4_4_ + 2;
  race_spec.choices = (nh_listitem *)malloc((long)(choices._4_4_ + 2) << 4);
  choices._4_4_ = 0;
  while (races[choices._4_4_].noun != (char *)0x0) {
    race_spec.choices[choices._4_4_].id = choices._4_4_;
    race_spec.choices[choices._4_4_].caption = races[choices._4_4_].noun;
    choices._4_4_ = choices._4_4_ + 1;
  }
  race_spec.choices[choices._4_4_].id = -1;
  race_spec.choices[choices._4_4_].caption = "ask";
  race_spec.choices[choices._4_4_ + 1].id = -2;
  race_spec.choices[choices._4_4_ + 1].caption = "random";
  return;
}

Assistant:

static void build_race_spec(void)
{
	int i;
	struct nh_listitem *choices;
	
	/* build list of races */
	for (i = 0; races[i].noun; i++)
	    ; /* just count em */
	race_spec.numchoices = i+2;
	choices = malloc((i+2) * sizeof(struct nh_listitem));
	for (i = 0; races[i].noun; i++) {
	    choices[i].id = i;
	    choices[i].caption = (char*)races[i].noun;
	}
	choices[i].id = ROLE_NONE;
	choices[i].caption = "ask";
	choices[i+1].id = ROLE_RANDOM;
	choices[i+1].caption = "random";
	
	race_spec.choices = choices;
}